

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall leveldb::log::LogTest::LogTest(LogTest *this)

{
  Writer *this_00;
  Reader *this_01;
  LogTest *this_local;
  
  StringDest::StringDest(&this->dest_);
  StringSource::StringSource(&this->source_);
  ReportCollector::ReportCollector(&this->report_);
  this->reading_ = false;
  this_00 = (Writer *)operator_new(0x20);
  Writer::Writer(this_00,(WritableFile *)this);
  this->writer_ = this_00;
  this_01 = (Reader *)operator_new(0x58);
  Reader::Reader(this_01,&(this->source_).super_SequentialFile,&(this->report_).super_Reporter,true,
                 0);
  this->reader_ = this_01;
  return;
}

Assistant:

LogTest()
      : reading_(false),
        writer_(new Writer(&dest_)),
        reader_(new Reader(&source_, &report_, true /*checksum*/,
                           0 /*initial_offset*/)) {}